

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_error(lua_State *L)

{
  TValue *errobj;
  lua_State *L_local;
  
  if ((*(char *)((L->top).offset + -8) == 'D') &&
     (*(TString **)((L->top).offset + -0x10) == L->l_G->memerrmsg)) {
    luaD_throw(L,4);
  }
  luaG_errormsg(L);
}

Assistant:

LUA_API int lua_error (lua_State *L) {
  TValue *errobj;
  lua_lock(L);
  errobj = s2v(L->top.p - 1);
  api_checknelems(L, 1);
  /* error object is the memory error message? */
  if (ttisshrstring(errobj) && eqshrstr(tsvalue(errobj), G(L)->memerrmsg))
    luaM_error(L);  /* raise a memory error */
  else
    luaG_errormsg(L);  /* raise a regular error */
  /* code unreachable; will unlock when control actually leaves the kernel */
  return 0;  /* to avoid warnings */
}